

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

int __thiscall AbstractContentContext::c(AbstractContentContext *this,void *param_1,void *param_2)

{
  EStatusCode EVar1;
  PrimitiveObjectsWriter *this_00;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  allocator<char> local_61;
  string local_60;
  double local_40;
  double inY3_local;
  double inX3_local;
  double inY2_local;
  double inX2_local;
  double inY1_local;
  double inX1_local;
  AbstractContentContext *this_local;
  
  local_40 = in_XMM5_Qa;
  inY3_local = in_XMM4_Qa;
  inX3_local = in_XMM3_Qa;
  inY2_local = in_XMM2_Qa;
  inX2_local = in_XMM1_Qa;
  inY1_local = in_XMM0_Qa;
  inX1_local = (double)this;
  RenewStreamConnectAndStoreResult(this);
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::WriteDouble(this_00,inY1_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,inX2_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,inY2_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,inX3_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,inY3_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_40,eTokenSeparatorSpace);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"c",&local_61);
  PrimitiveObjectsWriter::WriteKeyword(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  EVar1 = GetCurrentStatusCode(this);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::c(	double inX1,double inY1, 
							double inX2, double inY2, 
							double inX3, double inY3)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteDouble(inX1);
	mPrimitiveWriter.WriteDouble(inY1);
	mPrimitiveWriter.WriteDouble(inX2);
	mPrimitiveWriter.WriteDouble(inY2);
	mPrimitiveWriter.WriteDouble(inX3);
	mPrimitiveWriter.WriteDouble(inY3);
	mPrimitiveWriter.WriteKeyword("c");
	return GetCurrentStatusCode();
}